

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O2

Rational<long> Common::Number::gcd<long>(long *lhs,long *rhs)

{
  long lVar1;
  long lVar2;
  long local_20;
  Rational<long> local_18;
  
  local_20 = *lhs;
  lVar1 = *rhs;
  while (lVar1 != 0) {
    lVar2 = local_20 % lVar1;
    local_20 = lVar1;
    lVar1 = lVar2;
  }
  Rational<long>::Rational(&local_18,&local_20);
  return local_18;
}

Assistant:

const Rational<T> gcd(const T &lhs, const T &rhs) {
		return Rational<T>::gcd(lhs, rhs);
	}